

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O0

bool EqualityHelper(Sexp *first,Sexp *second)

{
  bool bVar1;
  int iVar2;
  Sexp *pSVar3;
  Sexp *pSVar4;
  bool local_5a;
  ContractFrameProtector local_28;
  ContractFrameProtector __contract_frame;
  Sexp *second_local;
  Sexp *first_local;
  
  __contract_frame.protected_frame = (ContractFrame *)second;
  ContractFrameProtector::ContractFrameProtector(&local_28,"EqualityHelper");
  ContractFrameProtector::AddContract(&local_28,NoGc);
  bVar1 = Sexp::IsCons(first);
  if ((bVar1) && (bVar1 = Sexp::IsCons((Sexp *)__contract_frame.protected_frame), bVar1)) {
    pSVar3 = Sexp::Car(first);
    pSVar4 = Sexp::Car((Sexp *)__contract_frame.protected_frame);
    bVar1 = EqualityHelper(pSVar3,pSVar4);
    local_5a = false;
    if (bVar1) {
      pSVar3 = Sexp::Cdr(first);
      pSVar4 = Sexp::Cdr((Sexp *)__contract_frame.protected_frame);
      local_5a = EqualityHelper(pSVar3,pSVar4);
    }
    first_local._7_1_ = local_5a;
    goto LAB_00150cb6;
  }
  bVar1 = Sexp::IsCons(first);
  if ((!bVar1) && (bVar1 = Sexp::IsCons((Sexp *)__contract_frame.protected_frame), !bVar1)) {
    bVar1 = Sexp::IsFixnum(first);
    if ((bVar1) && (bVar1 = Sexp::IsFixnum((Sexp *)__contract_frame.protected_frame), bVar1)) {
      first_local._7_1_ =
           (first->field_1).fixnum_value ==
           (double)(__contract_frame.protected_frame)->function_name;
      goto LAB_00150cb6;
    }
    bVar1 = Sexp::IsSymbol(first);
    if ((bVar1) && (bVar1 = Sexp::IsSymbol((Sexp *)__contract_frame.protected_frame), bVar1)) {
      first_local._7_1_ =
           (first->field_1).cons.car == (Sexp *)(__contract_frame.protected_frame)->function_name;
      goto LAB_00150cb6;
    }
    bVar1 = Sexp::IsString(first);
    if ((bVar1) && (bVar1 = Sexp::IsString((Sexp *)__contract_frame.protected_frame), bVar1)) {
      iVar2 = strcmp((first->field_1).string_value,(__contract_frame.protected_frame)->function_name
                    );
      first_local._7_1_ = iVar2 == 0;
      goto LAB_00150cb6;
    }
    bVar1 = Sexp::IsBool(first);
    if ((bVar1) && (bVar1 = Sexp::IsBool((Sexp *)__contract_frame.protected_frame), bVar1)) {
      first_local._7_1_ =
           ((first->field_1).bool_value & 1U) ==
           (*(byte *)&(__contract_frame.protected_frame)->function_name & 1);
      goto LAB_00150cb6;
    }
    if (first == (Sexp *)__contract_frame.protected_frame) {
      first_local._7_1_ = true;
      goto LAB_00150cb6;
    }
  }
  first_local._7_1_ = false;
LAB_00150cb6:
  ContractFrameProtector::~ContractFrameProtector(&local_28);
  return first_local._7_1_;
}

Assistant:

bool EqualityHelper(Sexp *first, Sexp *second) {
  CONTRACT { FORBID_GC; }